

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

SPIRVariable * __thiscall
diligent_spirv_cross::CompilerGLSL::find_subpass_input_by_attachment_index
          (CompilerGLSL *this,uint32_t index)

{
  anon_class_24_3_c26b1aa2 local_38;
  SPIRVariable *local_20;
  SPIRVariable *ret;
  CompilerGLSL *pCStack_10;
  uint32_t index_local;
  CompilerGLSL *this_local;
  
  local_20 = (SPIRVariable *)0x0;
  local_38.index = (uint32_t *)((long)&ret + 4);
  local_38.ret = &local_20;
  local_38.this = this;
  ret._4_4_ = index;
  pCStack_10 = this;
  ParsedIR::
  for_each_typed_id<diligent_spirv_cross::SPIRVariable,diligent_spirv_cross::CompilerGLSL::find_subpass_input_by_attachment_index(unsigned_int)const::__0>
            (&(this->super_Compiler).ir,&local_38);
  return local_20;
}

Assistant:

const SPIRVariable *CompilerGLSL::find_subpass_input_by_attachment_index(uint32_t index) const
{
	const SPIRVariable *ret = nullptr;
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		if (has_decoration(var.self, DecorationInputAttachmentIndex) &&
		    get_decoration(var.self, DecorationInputAttachmentIndex) == index)
		{
			ret = &var;
		}
	});
	return ret;
}